

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_bf16.h
# Opt level: O0

void ncnn::cast_bf16_to_fp32_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  int iVar6;
  long *in_RSI;
  long *in_RDI;
  int i;
  float *outptr;
  unsigned_short *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *m_1;
  __m256 _v;
  __m128i _b;
  __m128i _a;
  __m128i _zero;
  __m128 _v_1;
  __m128i _a_1;
  __m128i _zero_1;
  anon_union_4_2_947300b0 tmp;
  int local_49c;
  undefined1 (*local_450) [16];
  undefined1 (*local_3f0) [16];
  int local_3e4;
  undefined8 local_150;
  undefined8 uStack_148;
  ulong uStack_f8;
  ulong uStack_e8;
  
  lVar5 = in_RDI[7];
  iVar6 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_3e4 = 0; local_3e4 < (int)lVar5; local_3e4 = local_3e4 + 1) {
    local_3f0 = (undefined1 (*) [16])(*in_RDI + in_RDI[8] * (long)local_3e4 * in_RDI[2]);
    local_450 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_3e4 * in_RSI[2]);
    for (local_49c = 0; local_49c + 7 < iVar6; local_49c = local_49c + 8) {
      uStack_e8 = SUB168(ZEXT816(0),4);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uStack_e8;
      auVar2 = vpunpcklwd_avx(auVar1 << 0x40,*local_3f0);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uStack_e8;
      auVar1 = vpunpckhwd_avx(auVar3 << 0x40,*local_3f0);
      *local_450 = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      local_450[1] = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      local_3f0 = local_3f0 + 1;
      local_450 = local_450 + 2;
    }
    for (; local_49c + 3 < iVar6; local_49c = local_49c + 4) {
      uStack_f8 = SUB168(ZEXT816(0),4);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)*local_3f0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uStack_f8;
      auVar1 = vpunpcklwd_avx(auVar4 << 0x40,auVar2);
      local_150 = auVar1._0_8_;
      uStack_148 = auVar1._8_8_;
      *(undefined8 *)*local_450 = local_150;
      *(undefined8 *)(*local_450 + 8) = uStack_148;
      local_3f0 = (undefined1 (*) [16])(*local_3f0 + 8);
      local_450 = local_450 + 1;
    }
    for (; local_49c < iVar6; local_49c = local_49c + 1) {
      *(uint *)*local_450 = (uint)*(ushort *)*local_3f0 << 0x10;
      local_450 = (undefined1 (*) [16])(*local_450 + 4);
      local_3f0 = (undefined1 (*) [16])(*local_3f0 + 2);
    }
  }
  return;
}

Assistant:

static void cast_bf16_to_fp32_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_AVX512BF16 && __AVX512F__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx512_bf16())
    {
        cast_bf16_to_fp32_sse_avx512bf16(bottom_blob, top_blob, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx2())
    {
        cast_bf16_to_fp32_sse_avx2(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const unsigned short* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            _mm512_storeu_ps(outptr, bfloat2float_avx512(_mm256_loadu_si256((const __m256i*)ptr)));
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            _mm256_storeu_ps(outptr, bfloat2float_avx(_mm_loadu_si128((const __m128i*)ptr)));
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            _mm_storeu_ps(outptr, bfloat2float_sse(_mm_loadl_epi64((const __m128i*)ptr)));
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr++ = bfloat16_to_float32(*ptr++);
        }
    }
}